

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O1

int __thiscall QMakeProperty::setProperty(QMakeProperty *this,QStringList *optionProperties)

{
  QString var;
  char cVar1;
  int iVar2;
  QString *pQVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  undefined8 in_stack_ffffffffffffff48;
  QArrayData *pQVar5;
  QArrayData *local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  QArrayData *local_78;
  char16_t *pcStack_70;
  qsizetype local_68;
  QArrayData *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = 0;
  if ((optionProperties->d).size != 0) {
    pQVar3 = (optionProperties->d).ptr;
    do {
      local_78 = &((pQVar3->d).d)->super_QArrayData;
      pcStack_70 = (pQVar3->d).ptr;
      local_68 = (pQVar3->d).size;
      if (local_78 != (QArrayData *)0x0) {
        LOCK();
        (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_78->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (pQVar3 + 1 == (optionProperties->d).ptr + (optionProperties->d).size) {
        if (local_78 != (QArrayData *)0x0) {
          LOCK();
          (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_78,2,0x10);
          }
        }
        iVar2 = 0x65;
        goto LAB_002a213b;
      }
      QVar4.m_data = (storage_type *)0x1;
      QVar4.m_size = (qsizetype)&local_58;
      QString::fromUtf8(QVar4);
      local_98 = local_58;
      uStack_90 = uStack_50;
      local_88 = local_48;
      cVar1 = QString::startsWith((QString *)&local_78,(CaseSensitivity)&local_98);
      if (local_98 != (QArrayData *)0x0) {
        LOCK();
        (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_98,2,0x10);
        }
      }
      if (cVar1 == '\0') {
        if (local_78 != (QArrayData *)0x0) {
          LOCK();
          (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_78->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        var.d.ptr = (char16_t *)local_78;
        var.d.d = (Data *)in_stack_ffffffffffffff48;
        var.d.size = (qsizetype)pcStack_70;
        pQVar5 = local_78;
        setValue(this,var,(QString *)&stack0xffffffffffffff50);
        if (pQVar5 != (QArrayData *)0x0) {
          LOCK();
          (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar5,2,0x10);
          }
        }
      }
      if (local_78 != (QArrayData *)0x0) {
        LOCK();
        (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_78,2,0x10);
        }
      }
      pQVar3 = pQVar3 + 2;
    } while (pQVar3 != (optionProperties->d).ptr + (optionProperties->d).size);
    iVar2 = 0;
  }
LAB_002a213b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QMakeProperty::setProperty(const QStringList &optionProperties)
{
    for (auto it = optionProperties.cbegin(); it != optionProperties.cend(); ++it) {
        QString var = (*it);
        ++it;
        if (it == optionProperties.cend()) {
            return PropFailRetCode;
        }
        if (!var.startsWith("."))
            setValue(var, (*it));
    }
    return PropSuccessRetCode;
}